

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execLink<(moira::Core)2,(moira::Instr)68,(moira::Mode)12,2>(Moira *this,u16 opcode)

{
  StackFrame frame;
  i32 addr;
  bool bVar1;
  u16 sr;
  u32 uVar2;
  int iVar3;
  AddressError *this_00;
  StackFrame local_38;
  i32 local_20;
  uint local_1c;
  i32 disp;
  int ax;
  u32 sp;
  u16 ird;
  u16 opcode_local;
  Moira *this_local;
  
  this->cp = 0;
  ax._2_2_ = opcode;
  _sp = this;
  ax._0_2_ = getIRD(this);
  uVar2 = getSP(this);
  disp = uVar2 - 4;
  local_1c = ax._2_2_ & 7;
  uVar2 = readI<(moira::Core)2,2>(this);
  local_20 = SEXT<2>((ulong)uVar2);
  bVar1 = misaligned<(moira::Core)2,2>(this,disp);
  if (!bVar1) {
    (this->reg).ipl = this->ipl;
    uVar2 = readA<4>(this,local_1c);
    iVar3 = 0;
    if (local_1c == 7) {
      iVar3 = 4;
    }
    push<(moira::Core)2,4,0ull>(this,uVar2 - iVar3);
    writeA<4>(this,local_1c,disp);
    (this->reg).field_3.field_0.a[7] = (this->reg).field_3.field_0.a[7] + local_20;
    prefetch<(moira::Core)2,0ull>(this);
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 5));
    return;
  }
  uVar2 = readA<4>(this,local_1c);
  this->writeBuffer = (u16)(uVar2 >> 0x10);
  writeA<4>(this,local_1c,disp);
  this_00 = (AddressError *)__cxa_allocate_exception(0x20);
  addr = disp;
  uVar2 = getPC(this);
  sr = getSR(this);
  makeFrame<40ull>(&local_38,this,addr,uVar2 + 2,sr,(u16)ax);
  frame.ird = local_38.ird;
  frame.sr = local_38.sr;
  frame.pc = local_38.pc;
  frame.code = local_38.code;
  frame._2_2_ = local_38._2_2_;
  frame.addr = local_38.addr;
  frame.fc = local_38.fc;
  frame.ssw = local_38.ssw;
  AddressError::AddressError(this_00,frame);
  __cxa_throw(this_00,&AddressError::typeinfo,AddressError::~AddressError);
}

Assistant:

void
Moira::execLink(u16 opcode)
{
    AVAILABILITY(S == Long ? Core::C68020 : Core::C68000)

    u16 ird  = getIRD();
    u32 sp   = getSP() - 4;

    int ax   = _____________xxx(opcode);
    i32 disp = SEXT <S> (readI<C, S>());

    // Check for address error
    if (misaligned<C>(sp)) {

        writeBuffer = u16(readA(ax) >> 16);
        writeA(ax, sp);
        throw AddressError(makeFrame<AE_DATA|AE_WRITE>(sp, getPC() + 2, getSR(), ird));
    }

    POLL_IPL;

    // Write to stack
    push <C, Long>(readA(ax) - ((MOIRA_MIMIC_MUSASHI && ax == 7) ? 4 : 0));

    // Modify address register and stack pointer
    writeA(ax, sp);
    reg.sp = U32_ADD(reg.sp, disp);

    prefetch<C>();

    //           00  10  20        00  10  20        00  10  20
    //           .b  .b  .b        .w  .w  .w        .l  .l  .l
    CYCLES_IP   ( 0,  0,  0,       16, 16,  5,        0,  0,  6);

    FINALIZE
}